

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

pointer __thiscall
slang::SmallVectorBase<slang::SmallVector<int,_10UL>_>::emplaceRealloc<>
          (SmallVectorBase<slang::SmallVector<int,_10UL>_> *this,pointer pos)

{
  ulong uVar1;
  SmallVector<int,_10UL> *__result;
  long *plVar2;
  pointer __result_00;
  move_iterator<slang::SmallVector<int,_10UL>_*> __last;
  move_iterator<slang::SmallVector<int,_10UL>_*> __first;
  long lVar3;
  pointer pSVar4;
  ulong uVar5;
  
  if (this->len == 0x1ffffffffffffff) {
    detail::throwLengthError();
  }
  uVar5 = this->len + 1;
  uVar1 = this->cap;
  if (uVar5 < uVar1 * 2) {
    uVar5 = uVar1 * 2;
  }
  if (0x1ffffffffffffff - uVar1 < uVar1) {
    uVar5 = 0x1ffffffffffffff;
  }
  lVar3 = (long)pos - (long)this->data_;
  __result = (SmallVector<int,_10UL> *)operator_new(uVar5 << 6);
  plVar2 = (long *)((long)__result + lVar3);
  *plVar2 = (long)(plVar2 + 3);
  plVar2[1] = 0;
  pSVar4 = (pointer)(lVar3 + (long)__result);
  plVar2[2] = 10;
  __first._M_current = this->data_;
  __last._M_current = __first._M_current + this->len;
  __result_00 = __result;
  if (__last._M_current != pos) {
    std::__uninitialized_copy<false>::
    __uninit_copy<std::move_iterator<slang::SmallVector<int,10ul>*>,slang::SmallVector<int,10ul>*>
              (__first,(move_iterator<slang::SmallVector<int,_10UL>_*>)pos,__result);
    __last._M_current = this->data_ + this->len;
    __result_00 = pSVar4 + 1;
    __first._M_current = pos;
  }
  std::__uninitialized_copy<false>::
  __uninit_copy<std::move_iterator<slang::SmallVector<int,10ul>*>,slang::SmallVector<int,10ul>*>
            (__first,__last,__result_00);
  cleanup(this,(EVP_PKEY_CTX *)__last._M_current);
  this->len = this->len + 1;
  this->cap = uVar5;
  this->data_ = __result;
  return pSVar4;
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}